

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_clampVecScalarScalar_ivec4(ShaderEvalContext *c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (uint)c->in[0].m_data[0];
  uVar4 = (uint)c->in[0].m_data[1];
  uVar5 = (uint)c->in[0].m_data[2];
  uVar6 = (uint)c->in[0].m_data[3];
  uVar1 = (uint)c->in[2].m_data[1];
  uVar2 = (uint)c->in[1].m_data[0];
  (c->color).m_data[0] =
       (float)(int)(~-(uint)((int)uVar4 < (int)uVar2) &
                    (~-(uint)((int)uVar4 < (int)uVar1) & uVar1 |
                    uVar4 & -(uint)((int)uVar4 < (int)uVar1)) |
                   uVar2 & -(uint)((int)uVar4 < (int)uVar2));
  (c->color).m_data[1] =
       (float)(int)(~-(uint)((int)uVar5 < (int)uVar2) &
                    (~-(uint)((int)uVar5 < (int)uVar1) & uVar1 |
                    uVar5 & -(uint)((int)uVar5 < (int)uVar1)) |
                   uVar2 & -(uint)((int)uVar5 < (int)uVar2));
  (c->color).m_data[2] =
       (float)(int)(~-(uint)((int)uVar6 < (int)uVar2) &
                    (~-(uint)((int)uVar6 < (int)uVar1) & uVar1 |
                    uVar6 & -(uint)((int)uVar6 < (int)uVar1)) |
                   uVar2 & -(uint)((int)uVar6 < (int)uVar2));
  (c->color).m_data[3] =
       (float)(int)(~-(uint)((int)uVar3 < (int)uVar2) &
                    (~-(uint)((int)uVar3 < (int)uVar1) & uVar1 |
                    uVar3 & -(uint)((int)uVar3 < (int)uVar1)) |
                   uVar2 & -(uint)((int)uVar3 < (int)uVar2));
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }